

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void read_config_file(fnchar *filename)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  char *__s;
  char *local_30;
  char *line;
  char *buf;
  wchar_t fsize;
  FILE *fp;
  fnchar *filename_local;
  
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    iVar1 = (int)lVar2;
    rewind(__stream);
    if (iVar1 == 0) {
      fclose(__stream);
    }
    else {
      __s = (char *)malloc((long)(iVar1 + 1));
      if (__s == (char *)0x0) {
        fclose(__stream);
      }
      else {
        fread(__s,(long)iVar1,1,__stream);
        fclose(__stream);
        __s[iVar1] = '\0';
        local_30 = strtok(__s,"\n");
        do {
          read_config_line(local_30);
          local_30 = strtok((char *)0x0,"\n");
        } while (local_30 != (char *)0x0);
        free(__s);
      }
    }
  }
  return;
}

Assistant:

static void read_config_file(const fnchar *filename)
{
    FILE *fp;
    int fsize;
    char *buf, *line;
    
    fp = fopen(filename, "rb");
    if (!fp)
	return;

    /* obtain file size. */
    fseek(fp , 0 , SEEK_END);
    fsize = ftell(fp);
    rewind(fp);
    
    if (!fsize) {/* truncated config file */
	fclose(fp);
	return;
    }

    buf = malloc(fsize+1);
    if (!buf) {
	fclose(fp);
	return;
    }

    fread(buf, fsize, 1, fp);
    fclose(fp);
    
    buf[fsize] = '\0';
    
    /* each option is expected to have the following format:
	* name=value\n
	*/
    line = strtok(buf, "\n");
    do {
	read_config_line(line);
	
	line = strtok(NULL, "\n");
    } while (line);
    
    free(buf);
}